

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.h
# Opt level: O0

Expression __thiscall dynet::RNNBuilder::add_input(RNNBuilder *this,RNNPointer *prev,Expression *x)

{
  size_type sVar1;
  int *piVar2;
  undefined8 in_RCX;
  RNNPointer *in_RDX;
  undefined8 extraout_RDX;
  value_type *in_RSI;
  RNNStateMachine *in_RDI;
  Expression EVar3;
  RNNOp in_stack_ffffffffffffffbc;
  RNNStateMachine *this_00;
  int local_24;
  undefined8 local_20;
  RNNPointer *local_18;
  
  this_00 = in_RDI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  RNNStateMachine::transition(in_RDI,in_stack_ffffffffffffffbc);
  std::vector<dynet::RNNPointer,_std::allocator<dynet::RNNPointer>_>::push_back
            ((vector<dynet::RNNPointer,_std::allocator<dynet::RNNPointer>_> *)this_00,in_RSI);
  sVar1 = std::vector<dynet::RNNPointer,_std::allocator<dynet::RNNPointer>_>::size
                    ((vector<dynet::RNNPointer,_std::allocator<dynet::RNNPointer>_> *)(in_RSI + 6));
  local_24 = (int)sVar1 + -1;
  RNNPointer::operator=(in_RSI + 2,&local_24);
  piVar2 = RNNPointer::operator_cast_to_int_(local_18);
  (**(code **)(*(long *)in_RSI + 0x68))(in_RDI,in_RSI,*piVar2,local_20);
  EVar3._8_8_ = extraout_RDX;
  EVar3.pg = (ComputationGraph *)this_00;
  return EVar3;
}

Assistant:

Expression add_input(const RNNPointer& prev, const Expression& x) {
    sm.transition(RNNOp::add_input);
    head.push_back(prev);
    cur = head.size() - 1;
    return add_input_impl(prev, x);
  }